

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpacking.cpp
# Opt level: O2

bool __thiscall
duckdb::BitpackingState<duckdb::hugeint_t,duckdb::hugeint_t>::
Update<duckdb::BitpackingCompressionState<duckdb::hugeint_t,true,duckdb::hugeint_t>::BitpackingWriter>
          (BitpackingState<duckdb::hugeint_t,duckdb::hugeint_t> *this,hugeint_t value,bool is_valid)

{
  long lVar1;
  hugeint_t b;
  hugeint_t a;
  hugeint_t a_00;
  bool bVar2;
  uint64_t in_RAX;
  long lVar3;
  int64_t unaff_RBX;
  uint64_t unaff_R14;
  int64_t unaff_R15;
  hugeint_t hVar4;
  
  lVar3 = *(long *)(this + 0x10818);
  this[lVar3 + 0x10018] = (BitpackingState<duckdb::hugeint_t,duckdb::hugeint_t>)is_valid;
  this[0x108a0] =
       (BitpackingState<duckdb::hugeint_t,duckdb::hugeint_t>)((byte)this[0x108a0] & is_valid);
  this[0x108a1] =
       (BitpackingState<duckdb::hugeint_t,duckdb::hugeint_t>)((byte)this[0x108a1] & !is_valid);
  if (is_valid) {
    lVar1 = *(long *)(this + 0x8010);
    *(uint64_t *)(lVar1 + lVar3 * 0x10) = value.lower;
    *(int64_t *)(lVar1 + 8 + lVar3 * 0x10) = value.upper;
    a.upper = unaff_R15;
    a.lower = unaff_R14;
    hVar4.upper = unaff_RBX;
    hVar4.lower = in_RAX;
    hVar4 = MinValue<duckdb::hugeint_t>(a,hVar4);
    *(hugeint_t *)(this + 0x10830) = hVar4;
    a_00.upper = unaff_R15;
    a_00.lower = unaff_R14;
    b.upper = unaff_RBX;
    b.lower = in_RAX;
    hVar4 = MaxValue<duckdb::hugeint_t>(a_00,b);
    *(hugeint_t *)(this + 0x10840) = hVar4;
    lVar3 = *(long *)(this + 0x10818);
  }
  *(long *)(this + 0x10818) = lVar3 + 1;
  if (lVar3 + 1 == 0x800) {
    bVar2 = Flush<duckdb::BitpackingCompressionState<duckdb::hugeint_t,true,duckdb::hugeint_t>::BitpackingWriter>
                      (this);
    BitpackingState<duckdb::hugeint_t,_duckdb::hugeint_t>::Reset
              ((BitpackingState<duckdb::hugeint_t,_duckdb::hugeint_t> *)this);
  }
  else {
    bVar2 = true;
  }
  return bVar2;
}

Assistant:

bool Update(T value, bool is_valid) {
		compression_buffer_validity[compression_buffer_idx] = is_valid;
		all_valid = all_valid && is_valid;
		all_invalid = all_invalid && !is_valid;

		if (is_valid) {
			compression_buffer[compression_buffer_idx] = value;
			minimum = MinValue<T>(minimum, value);
			maximum = MaxValue<T>(maximum, value);
		}

		compression_buffer_idx++;

		if (compression_buffer_idx == BITPACKING_METADATA_GROUP_SIZE) {
			bool success = Flush<OP>();
			Reset();
			return success;
		}
		return true;
	}